

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_p_p.h
# Opt level: O0

void __thiscall
QNativeSocketEnginePrivate::setPortAndAddress
          (QNativeSocketEnginePrivate *this,quint16 port,QHostAddress *address,qt_sockaddr *aa,
          socklen_t *sockAddrSize)

{
  int iVar1;
  socklen_t sVar2;
  sockaddr_in6 *in_RCX;
  long in_RDI;
  sockaddr_in *in_R8;
  quint16 in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  quint16 port_00;
  
  iVar1 = *(int *)(in_RDI + 0xa0);
  port_00 = (quint16)((uint)iVar1 >> 0x10);
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      anon_unknown.dwarf_89ccd3::setSockaddr
                (in_R8,(QHostAddress *)
                       CONCAT26(port_00,CONCAT24((short)iVar1,in_stack_ffffffffffffffd0)),
                 in_stack_ffffffffffffffce);
      in_R8->sin_family = 0x10;
      in_R8->sin_port = 0;
      return;
    }
    if (iVar1 == 1 || iVar1 == 2) {
      anon_unknown.dwarf_89ccd3::setSockaddr(in_RCX,(QHostAddress *)in_R8,port_00);
      in_R8->sin_family = 0x1c;
      in_R8->sin_port = 0;
      return;
    }
  }
  sVar2 = anon_unknown.dwarf_89ccd3::setSockaddr((sockaddr *)in_RCX,(QHostAddress *)in_R8,port_00);
  in_R8->sin_family = (short)sVar2;
  in_R8->sin_port = (short)(sVar2 >> 0x10);
  return;
}

Assistant:

void setPortAndAddress(quint16 port, const QHostAddress &address, qt_sockaddr *aa, QT_SOCKLEN_T *sockAddrSize)
    {
        switch (socketProtocol) {
        case QHostAddress::IPv6Protocol:
        case QHostAddress::AnyIPProtocol:
            // force to IPv6
            setSockaddr(&aa->a6, address, port);
            *sockAddrSize = sizeof(sockaddr_in6);
            return;

        case QHostAddress::IPv4Protocol:
            // force to IPv4
            setSockaddr(&aa->a4, address, port);
            *sockAddrSize = sizeof(sockaddr_in);
            return;

        case QHostAddress::UnknownNetworkLayerProtocol:
            // don't force
            break;
        }
        *sockAddrSize = setSockaddr(&aa->a, address, port);
    }